

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall Js::InterpreterStackFrame::OP_LdLocalObj(InterpreterStackFrame *this)

{
  bool bVar1;
  InterpreterStackFrame *this_local;
  
  bVar1 = VirtualTableInfo<Js::ActivationObject>::HasVirtualTable(*(void **)(this + 0x58));
  if (!bVar1) {
    bVar1 = VirtualTableInfo<Js::ActivationObjectEx>::HasVirtualTable(*(void **)(this + 0x58));
    if (!bVar1) {
      Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  return *(Var *)(this + 0x58);
}

Assistant:

Var InterpreterStackFrame::OP_LdLocalObj()
    {
        if (!VirtualTableInfo<ActivationObject>::HasVirtualTable(this->localClosure) &&
            !VirtualTableInfo<ActivationObjectEx>::HasVirtualTable(this->localClosure))
        {
            Js::Throw::FatalInternalError();
        }
        return this->localClosure;
    }